

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_pmeth.c
# Opt level: O2

int pkey_gost_ec_ctrl_str_512(EVP_PKEY_CTX *ctx,char *type,char *value)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  __int32_t **pp_Var4;
  R3410_ec_params *pRVar5;
  int *piVar6;
  
  iVar2 = strcmp(type,"paramset");
  if (iVar2 != 0) {
    iVar2 = pkey_gost_ec_ctrl_str_common(ctx,type,value);
    return iVar2;
  }
  if (value == (char *)0x0) {
    return 0;
  }
  sVar3 = strlen(value);
  if (sVar3 == 1) {
    pp_Var4 = __ctype_toupper_loc();
    if (2 < (*pp_Var4)[(byte)*value] - 0x41U) {
      return 0;
    }
    iVar2 = *(int *)(&DAT_0013fd60 + (ulong)((*pp_Var4)[(byte)*value] - 0x41U) * 4);
  }
  else {
    iVar2 = OBJ_txt2nid(value);
    if (iVar2 == 0) {
      return 0;
    }
    pRVar5 = R3410_2012_512_paramset;
    do {
      iVar1 = pRVar5->nid;
      if (iVar1 == 0) break;
      pRVar5 = pRVar5 + 1;
    } while (iVar1 != iVar2);
    if (iVar1 == 0) {
      ERR_GOST_error(0x7e,0x76,
                     "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_pmeth.c"
                     ,0x166);
      return 0;
    }
  }
  piVar6 = (int *)EVP_PKEY_CTX_get_data((EVP_PKEY_CTX *)ctx);
  if (piVar6 != (int *)0x0) {
    *piVar6 = iVar2;
  }
  return (uint)(piVar6 != (int *)0x0);
}

Assistant:

static int pkey_gost_ec_ctrl_str_512(EVP_PKEY_CTX *ctx,
                                     const char *type, const char *value)
{
    int param_nid = NID_undef;

    if (strcmp(type, param_ctrl_string))
      return pkey_gost_ec_ctrl_str_common(ctx, type, value);

    if (!value)
        return 0;

    if (strlen(value) == 1) {
        switch (toupper((unsigned char)value[0])) {
        case 'A':
            param_nid = NID_id_tc26_gost_3410_2012_512_paramSetA;
            break;

        case 'B':
            param_nid = NID_id_tc26_gost_3410_2012_512_paramSetB;
            break;

        case 'C':
            param_nid = NID_id_tc26_gost_3410_2012_512_paramSetC;
            break;

        default:
            return 0;
        }
    } else {
        R3410_ec_params *p = R3410_2012_512_paramset;
        param_nid = OBJ_txt2nid(value);
        if (param_nid == NID_undef)
            return 0;

        while (p->nid != NID_undef && p->nid != param_nid)
            p++;

        if (p->nid == NID_undef) {
            GOSTerr(GOST_F_PKEY_GOST_EC_CTRL_STR_512,
                    GOST_R_INVALID_PARAMSET);
            return 0;
        }
    }

    return pkey_gost_ctrl(ctx, EVP_PKEY_CTRL_GOST_PARAMSET, param_nid, NULL);
}